

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor_injection.cpp
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main() {
  /*<<make injector>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().named(name).to(42)
  );
  // clang-format on

  /*<<create dependencies>>*/
  injector.create<ctor_inject>();
  injector.create<ctor_inject_traits>();
  injector.create<ctor_di_traits>();

  injector.create<ctor_inject_traits_no_limits>();
}